

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O0

bool __thiscall libcellml::Importer::removeImportSource(Importer *this,size_t index)

{
  bool bVar1;
  ImportSourcePtr importSrc;
  size_t index_local;
  Importer *this_local;
  
  importSrc.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)index;
  importSource((Importer *)&stack0xffffffffffffffd8,(size_t)this);
  bVar1 = removeImportSource(this,(ImportSourcePtr *)&stack0xffffffffffffffd8);
  std::shared_ptr<libcellml::ImportSource>::~shared_ptr
            ((shared_ptr<libcellml::ImportSource> *)&stack0xffffffffffffffd8);
  return bVar1;
}

Assistant:

bool Importer::removeImportSource(size_t index)
{
    auto importSrc = importSource(index);
    return removeImportSource(importSrc);
}